

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall re2::Prog::Optimize(Prog *this)

{
  Inst *pIVar1;
  uint uVar2;
  Inst *pIVar3;
  Inst *pIVar4;
  bool bVar5;
  Inst *pIVar6;
  Inst *pIVar7;
  uint uVar8;
  uint *puVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  Workq q;
  SparseSet local_48;
  
  SparseSet::SparseSet(&local_48,this->size_);
  local_48.size_ = 0;
  iVar11 = this->start_;
  if ((iVar11 != 0) && (bVar5 = SparseSet::contains(&local_48,iVar11), !bVar5)) {
    SparseSet::insert_new(&local_48,iVar11);
  }
  puVar9 = (uint *)local_48.dense_;
  if (local_48.size_ != 0) {
    do {
      uVar2 = *puVar9;
      pIVar3 = this->inst_;
      uVar10 = pIVar3[(int)uVar2].out_opcode_;
      do {
        uVar8 = uVar10;
        if (uVar8 < 0x10) break;
        uVar10 = pIVar3[uVar8 >> 4].out_opcode_;
      } while ((pIVar3[uVar8 >> 4].out_opcode_ & 7) == 6);
      pIVar3[(int)uVar2].out_opcode_ = pIVar3[(int)uVar2].out_opcode_ & 0xf | uVar8 & 0xfffffff0;
      if (0xf < uVar8) {
        bVar5 = SparseSet::contains(&local_48,uVar8 >> 4);
        if (!bVar5) {
          SparseSet::insert_new(&local_48,uVar8 >> 4);
        }
      }
      if ((pIVar3[(int)uVar2].out_opcode_ & 7) == 0) {
        uVar10 = pIVar3[(int)uVar2].field_1.cap_;
        uVar12 = (ulong)(int)uVar10;
        bVar5 = uVar12 == 0;
        if (bVar5) {
LAB_00131319:
          pIVar3[(int)uVar2].field_1.cap_ = uVar10;
        }
        else {
          uVar8 = this->inst_[uVar12].out_opcode_;
          while ((uVar8 & 7) == 6) {
            uVar10 = uVar8 >> 4;
            uVar12 = (ulong)uVar10;
            bVar5 = uVar8 < 0x10;
            if (bVar5) goto LAB_00131319;
            uVar8 = this->inst_[uVar12].out_opcode_;
          }
          iVar11 = (int)uVar12;
          pIVar3[(int)uVar2].field_1.cap_ = iVar11;
          if ((!bVar5) && (bVar5 = SparseSet::contains(&local_48,iVar11), !bVar5)) {
            SparseSet::insert_new(&local_48,iVar11);
          }
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != (uint *)(local_48.dense_ + local_48.size_));
  }
  local_48.size_ = 0;
  iVar11 = this->start_;
  if ((iVar11 != 0) && (bVar5 = SparseSet::contains(&local_48,iVar11), !bVar5)) {
    SparseSet::insert_new(&local_48,iVar11);
  }
  puVar9 = (uint *)local_48.dense_;
  if (local_48.size_ != 0) {
    do {
      uVar2 = *puVar9;
      pIVar3 = this->inst_;
      if (0xf < pIVar3[(int)uVar2].out_opcode_) {
        uVar10 = pIVar3[(int)uVar2].out_opcode_ >> 4;
        bVar5 = SparseSet::contains(&local_48,uVar10);
        if (!bVar5) {
          SparseSet::insert_new(&local_48,uVar10);
        }
      }
      if ((((pIVar3[(int)uVar2].out_opcode_ & 7) == 0) &&
          (iVar11 = pIVar3[(int)uVar2].field_1.cap_, iVar11 != 0)) &&
         (bVar5 = SparseSet::contains(&local_48,iVar11), !bVar5)) {
        SparseSet::insert_new(&local_48,iVar11);
      }
      uVar10 = pIVar3[(int)uVar2].out_opcode_;
      if ((uVar10 & 7) == 0) {
        pIVar4 = this->inst_;
        pIVar6 = pIVar4 + (uVar10 >> 4);
        pIVar1 = pIVar4 + pIVar3[(int)uVar2].field_1.cap_;
        if ((((pIVar6->out_opcode_ & 7) == 2) && (pIVar6->out_opcode_ >> 4 == uVar2)) &&
           (((pIVar6->field_1).field_3.lo_ == '\0' &&
            (pIVar7 = pIVar1, (pIVar6->field_1).field_3.hi_ == 0xff)))) {
          while( true ) {
            uVar8 = pIVar7->out_opcode_ & 7;
            if ((0x48U >> uVar8 & 1) == 0) break;
            pIVar7 = pIVar4 + (pIVar7->out_opcode_ >> 4);
          }
          if ((0x97U >> uVar8 & 1) != 0) goto LAB_00131466;
        }
        else {
LAB_00131466:
          while( true ) {
            uVar8 = pIVar6->out_opcode_ & 7;
            if ((0x48U >> uVar8 & 1) == 0) break;
            pIVar6 = pIVar4 + (pIVar6->out_opcode_ >> 4);
          }
          if ((((0x97U >> uVar8 & 1) != 0) || ((pIVar1->out_opcode_ & 7) != 2)) ||
             ((pIVar1->out_opcode_ >> 4 != uVar2 ||
              (((pIVar1->field_1).field_3.lo_ != '\0' || ((pIVar1->field_1).field_3.hi_ != 0xff)))))
             ) goto LAB_0013147d;
        }
        pIVar3[(int)uVar2].out_opcode_ = uVar10 | 1;
      }
LAB_0013147d:
      puVar9 = puVar9 + 1;
    } while (puVar9 != (uint *)(local_48.dense_ + local_48.size_));
  }
  SparseSet::~SparseSet(&local_48);
  return;
}

Assistant:

void Prog::Optimize() {
  Workq q(size_);

  // Eliminate nops.  Most are taken out during compilation
  // but a few are hard to avoid.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;

    Inst* ip = inst(id);
    int j = ip->out();
    Inst* jp;
    while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
      j = jp->out();
    }
    ip->set_out(j);
    AddToQueue(&q, ip->out());

    if (ip->opcode() == kInstAlt) {
      j = ip->out1();
      while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
        j = jp->out();
      }
      ip->out1_ = j;
      AddToQueue(&q, ip->out1());
    }
  }

  // Insert kInstAltMatch instructions
  // Look for
  //   ip: Alt -> j | k
  //	  j: ByteRange [00-FF] -> ip
  //    k: Match
  // or the reverse (the above is the greedy one).
  // Rewrite Alt to AltMatch.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;
    Inst* ip = inst(id);
    AddToQueue(&q, ip->out());
    if (ip->opcode() == kInstAlt)
      AddToQueue(&q, ip->out1());

    if (ip->opcode() == kInstAlt) {
      Inst* j = inst(ip->out());
      Inst* k = inst(ip->out1());
      if (j->opcode() == kInstByteRange && j->out() == id &&
          j->lo() == 0x00 && j->hi() == 0xFF &&
          IsMatch(this, k)) {
        ip->set_opcode(kInstAltMatch);
        continue;
      }
      if (IsMatch(this, j) &&
          k->opcode() == kInstByteRange && k->out() == id &&
          k->lo() == 0x00 && k->hi() == 0xFF) {
        ip->set_opcode(kInstAltMatch);
      }
    }
  }
}